

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O0

void __thiscall
tchecker::system::edges_t::add_edge
          (edges_t *this,process_id_t pid,loc_id_t src,loc_id_t tgt,event_id_t event_id,
          attributes_t *attributes)

{
  bool bVar1;
  edge_id_t eVar2;
  size_type sVar3;
  runtime_error *this_00;
  edge_t *this_01;
  __shared_ptr_access<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  __shared_ptr_access<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var4;
  element_type *peVar5;
  undefined1 local_50 [8];
  edge_shared_ptr_t edge;
  edge_id_t id;
  attributes_t *attributes_local;
  event_id_t event_id_local;
  loc_id_t tgt_local;
  loc_id_t src_local;
  process_id_t pid_local;
  edges_t *this_local;
  
  sVar3 = std::
          vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
          ::size(&this->_edges);
  bVar1 = valid_edge_id((edge_id_t)sVar3);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"add_edge: invalid edge identifier");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (edge_t *)operator_new(0x50);
  system::edge_t::edge_t(this_01,pid,(edge_id_t)sVar3,src,tgt,event_id,attributes);
  std::shared_ptr<tchecker::system::edge_t>::shared_ptr<tchecker::system::edge_t,void>
            ((shared_ptr<tchecker::system::edge_t> *)local_50,this_01);
  std::
  vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
  ::push_back(&this->_edges,(shared_ptr<tchecker::system::edge_t> *)local_50);
  this_02 = (__shared_ptr_access<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
               ::back(&this->_edges);
  this_03 = std::
            __shared_ptr_access<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_02);
  eVar2 = system::edge_t::id(this_03);
  sVar3 = std::
          vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
          ::size(&this->_edges);
  if ((ulong)eVar2 == sVar3 - 1) {
    p_Var4 = (__shared_ptr_access<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<tchecker::system::loc_edges_maps_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_edges_maps_t>_>_>
                ::operator[](&this->_loc_edges_maps,0);
    peVar5 = std::
             __shared_ptr_access<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    loc_edges_maps_t::add_edge(peVar5,tgt,(edge_shared_ptr_t *)local_50);
    p_Var4 = (__shared_ptr_access<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<tchecker::system::loc_edges_maps_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_edges_maps_t>_>_>
                ::operator[](&this->_loc_edges_maps,1);
    peVar5 = std::
             __shared_ptr_access<tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    loc_edges_maps_t::add_edge(peVar5,src,(edge_shared_ptr_t *)local_50);
    proc_edges_maps_t::add_edge(&this->_proc_edges_map,pid,(edge_shared_ptr_t *)local_50);
    std::shared_ptr<tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<tchecker::system::edge_t> *)local_50);
    return;
  }
  __assert_fail("_edges.back()->id() == _edges.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/edge.cc"
                ,0xcc,
                "void tchecker::system::edges_t::add_edge(tchecker::process_id_t, tchecker::loc_id_t, tchecker::loc_id_t, tchecker::event_id_t, const tchecker::system::attributes_t &)"
               );
}

Assistant:

void edges_t::add_edge(tchecker::process_id_t pid, tchecker::loc_id_t src, tchecker::loc_id_t tgt,
                       tchecker::event_id_t event_id, tchecker::system::attributes_t const & attributes)
{
  tchecker::edge_id_t id = _edges.size();

  if (!tchecker::valid_edge_id(id))
    throw std::runtime_error("add_edge: invalid edge identifier");

  tchecker::system::edge_shared_ptr_t edge(new tchecker::system::edge_t(pid, id, src, tgt, event_id, attributes));
  _edges.push_back(edge);
  assert(_edges.back()->id() == _edges.size() - 1);

  _loc_edges_maps[tchecker::system::INCOMING_EDGE]->add_edge(tgt, edge);
  _loc_edges_maps[tchecker::system::OUTGOING_EDGE]->add_edge(src, edge);

  _proc_edges_map.add_edge(pid, edge);
}